

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_allocator.hpp
# Opt level: O2

data_ptr_t __thiscall duckdb::ArenaAllocator::Allocate(ArenaAllocator *this,idx_t len)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  
  lVar2 = *(long *)(this + 0x10);
  if (lVar2 != 0) {
    lVar1 = *(long *)(lVar2 + 0x18);
    uVar3 = lVar1 + len;
    if (uVar3 <= *(ulong *)(lVar2 + 0x20)) goto LAB_002c957c;
  }
  duckdb::ArenaAllocator::AllocateNewBlock((ulong)this);
  lVar2 = *(long *)(this + 0x10);
  lVar1 = *(long *)(lVar2 + 0x18);
  uVar3 = len + lVar1;
LAB_002c957c:
  *(ulong *)(lVar2 + 0x18) = uVar3;
  return (data_ptr_t)(lVar1 + *(long *)(lVar2 + 8));
}

Assistant:

data_ptr_t Allocate(idx_t len) {
		D_ASSERT(!head || head->current_position <= head->maximum_size);
		if (!head || head->current_position + len > head->maximum_size) {
			AllocateNewBlock(len);
		}
		D_ASSERT(head->current_position + len <= head->maximum_size);
		auto result = head->data.get() + head->current_position;
		head->current_position += len;
		return result;
	}